

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::ShaderSourceSplitCase::buildProgram
          (ShaderSourceSplitCase *this,Shader *shader)

{
  ShaderType shaderType;
  deUint32 dVar1;
  TestLog *log_00;
  RenderContext *renderCtx_00;
  char *__to;
  char *__from;
  undefined1 local_e0 [8];
  Program program;
  Shader supportShader;
  char *supportShaderSource;
  ShaderType supportShaderType;
  RenderContext *renderCtx;
  TestLog *log;
  Shader *shader_local;
  ShaderSourceSplitCase *this_local;
  
  log_00 = tcu::TestContext::getLog
                     ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  renderCtx_00 = gles2::Context::getRenderContext((this->super_ApiCase).super_TestCase.m_context);
  shaderType = (ShaderType)(this->m_shaderType != SHADERTYPE_FRAGMENT);
  supportShader.m_info.compileTimeUs =
       (deUint64)Functional::anon_unknown_0::getSimpleShaderSource(shaderType);
  glu::Shader::Shader((Shader *)&program.m_info.linkTimeUs,renderCtx_00,shaderType);
  glu::Program::Program((Program *)local_e0,renderCtx_00);
  glu::Shader::setSources
            ((Shader *)&program.m_info.linkTimeUs,1,(char **)&supportShader.m_info.compileTimeUs,
             (int *)0x0);
  glu::Shader::compile((Shader *)&program.m_info.linkTimeUs);
  dVar1 = glu::Shader::getShader(shader);
  glu::Program::attachShader((Program *)local_e0,dVar1);
  dVar1 = glu::Shader::getShader((Shader *)&program.m_info.linkTimeUs);
  __from = (char *)(ulong)dVar1;
  glu::Program::attachShader((Program *)local_e0,dVar1);
  glu::Program::link((Program *)local_e0,__from,__to);
  if (this->m_shaderType == SHADERTYPE_VERTEX) {
    Functional::anon_unknown_0::logVertexFragmentProgram
              (log_00,renderCtx_00,(Program *)local_e0,shader,(Shader *)&program.m_info.linkTimeUs);
  }
  else {
    Functional::anon_unknown_0::logVertexFragmentProgram
              (log_00,renderCtx_00,(Program *)local_e0,(Shader *)&program.m_info.linkTimeUs,shader);
  }
  glu::Program::~Program((Program *)local_e0);
  glu::Shader::~Shader((Shader *)&program.m_info.linkTimeUs);
  return;
}

Assistant:

void buildProgram (glu::Shader& shader)
	{
		TestLog&				log					= m_testCtx.getLog();
		glu::RenderContext&		renderCtx			= m_context.getRenderContext();

		const glu::ShaderType	supportShaderType	= (m_shaderType == glu::SHADERTYPE_FRAGMENT ? glu::SHADERTYPE_VERTEX : glu::SHADERTYPE_FRAGMENT);
		const char*				supportShaderSource	= getSimpleShaderSource(supportShaderType);
		glu::Shader				supportShader		(renderCtx, supportShaderType);

		glu::Program			program				(renderCtx);

		supportShader.setSources(1, &supportShaderSource, 0);
		supportShader.compile();

		program.attachShader(shader.getShader());
		program.attachShader(supportShader.getShader());

		program.link();

		if (m_shaderType == glu::SHADERTYPE_VERTEX)
			logVertexFragmentProgram(log, renderCtx, program, shader, supportShader);
		else
			logVertexFragmentProgram(log, renderCtx, program, supportShader, shader);
	}